

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printer.hpp
# Opt level: O2

void __thiscall
trial::protocol::json::example::pretty_printer::print_object_element(pretty_printer *this,int count)

{
  basic_reader<char> *this_00;
  bool bVar1;
  value vVar2;
  size_type sVar3;
  error *this_01;
  error_category *peVar4;
  error_code ec;
  error_code ec_00;
  view_type key;
  view_type local_28;
  
  vVar2 = basic_reader<char>::symbol(this->reader);
  if (vVar2 == key) {
    if (0 < count) {
      key._M_len = 1;
      key._M_str = ",";
      basic_writer<char,_16UL>::literal(this->writer,&key);
      newline(this);
    }
    sVar3 = basic_reader<char>::level(this->reader);
    indent(this,(int)sVar3);
    this_00 = this->reader;
    key._M_str = (this_00->decoder).current.view.head;
    key._M_len = (long)(this_00->decoder).current.view.tail - (long)key._M_str;
    bVar1 = basic_reader<char>::next(this_00);
    if (bVar1) {
      basic_writer<char,_16UL>::literal(this->writer,&key);
      local_28._M_len = 3;
      local_28._M_str = " : ";
      basic_writer<char,_16UL>::literal(this->writer,&local_28);
      vVar2 = basic_reader<char>::symbol(this->reader);
      if (vVar2 == begin_object) {
        print_object(this,false);
      }
      else if (vVar2 == begin_array) {
        print_array(this,false);
      }
      else {
        print_value(this);
      }
      return;
    }
    this_01 = (error *)__cxa_allocate_exception(0x20);
    peVar4 = error_category();
    ec_00._M_cat = peVar4;
    ec_00._0_8_ = 3;
    error::error(this_01,ec_00);
  }
  else {
    this_01 = (error *)__cxa_allocate_exception(0x20);
    peVar4 = error_category();
    ec._M_cat = peVar4;
    ec._0_8_ = 2;
    error::error(this_01,ec);
  }
  __cxa_throw(this_01,&error::typeinfo,std::system_error::~system_error);
}

Assistant:

void print_object_element(int count)
    {
        if (reader.symbol() != json::token::symbol::key)
            throw json::error(make_error_code(json::invalid_key));

        // Print value separator
        if (count > 0)
        {
            writer.literal(",");
            newline();
        }

        indent(reader.level());

        json::reader::view_type key = reader.literal();
        if (!reader.next())
            throw json::error(make_error_code(json::invalid_value));

        // Print key
        writer.literal(key);

        // Print key separator
        writer.literal(" : ");

        // Print value
        switch (reader.symbol())
        {
        case json::token::symbol::begin_array:
            print_array(false);
            break;

        case json::token::symbol::begin_object:
            print_object(false);
            break;

        default:
            print_value();
            break;
        }
    }